

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphIO.cpp
# Opt level: O0

void __thiscall CGraphIO::~CGraphIO(CGraphIO *this)

{
  CGraphIO *this_local;
  
  ~CGraphIO(this);
  operator_delete(this);
  return;
}

Assistant:

CGraphIO::~CGraphIO()
{
	m_vi_Vertices.clear();
	m_vi_OrderedVertices.clear();
	m_vi_Edges.clear();
	m_vd_Values.clear();
}